

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::BinaryExpressionSyntax::BinaryExpressionSyntax
          (BinaryExpressionSyntax *this,SyntaxKind kind,ExpressionSyntax *left,Token operatorToken,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,ExpressionSyntax *right)

{
  ExpressionSyntax *pEVar1;
  iterator ppAVar2;
  AttributeInstanceSyntax *child;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *__range2;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *local_40;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *local_38;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes_local;
  ExpressionSyntax *left_local;
  BinaryExpressionSyntax *pBStack_20;
  SyntaxKind kind_local;
  BinaryExpressionSyntax *this_local;
  Token operatorToken_local;
  
  operatorToken_local._0_8_ = operatorToken.info;
  this_local = operatorToken._0_8_;
  local_38 = attributes;
  attributes_local = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)left;
  left_local._4_4_ = kind;
  pBStack_20 = this;
  ExpressionSyntax::ExpressionSyntax(&this->super_ExpressionSyntax,kind);
  local_40 = attributes_local;
  not_null<slang::syntax::ExpressionSyntax*>::not_null<slang::syntax::ExpressionSyntax*,void>
            ((not_null<slang::syntax::ExpressionSyntax*> *)&this->left,
             (ExpressionSyntax **)&local_40);
  *(BinaryExpressionSyntax **)&this->operatorToken = this_local;
  (this->operatorToken).info = (Info *)operatorToken_local._0_8_;
  SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList(&this->attributes,local_38);
  __range2 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)right;
  not_null<slang::syntax::ExpressionSyntax*>::not_null<slang::syntax::ExpressionSyntax*,void>
            ((not_null<slang::syntax::ExpressionSyntax*> *)&this->right,
             (ExpressionSyntax **)&__range2);
  pEVar1 = not_null<slang::syntax::ExpressionSyntax_*>::operator->(&this->left);
  (pEVar1->super_SyntaxNode).parent = (SyntaxNode *)this;
  (this->attributes).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  __end2 = nonstd::span_lite::span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>
           ::begin(&(this->attributes).
                    super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>);
  ppAVar2 = nonstd::span_lite::
            span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>::end
                      (&(this->attributes).
                        super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>
                      );
  for (; __end2 != ppAVar2; __end2 = __end2 + 1) {
    ((*__end2)->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  pEVar1 = not_null<slang::syntax::ExpressionSyntax_*>::operator->(&this->right);
  (pEVar1->super_SyntaxNode).parent = (SyntaxNode *)this;
  return;
}

Assistant:

BinaryExpressionSyntax(SyntaxKind kind, ExpressionSyntax& left, Token operatorToken, const SyntaxList<AttributeInstanceSyntax>& attributes, ExpressionSyntax& right) :
        ExpressionSyntax(kind), left(&left), operatorToken(operatorToken), attributes(attributes), right(&right) {
        this->left->parent = this;
        this->attributes.parent = this;
        for (auto child : this->attributes)
            child->parent = this;
        this->right->parent = this;
    }